

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O3

void __thiscall GcHeap::GcHeapImpl::VerifyHeap(GcHeapImpl *this)

{
  long *plVar1;
  Sexp *pSVar2;
  _List_node_base *p_Var3;
  undefined1 local_b0 [8];
  unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_> visited;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  Sexp *local_50;
  Sexp *ptr;
  vector<Sexp_*,_std::allocator<Sexp_*>_> stack;
  
  DebugLog("[%d] verifying heap",this->gc_number);
  ptr = (Sexp *)0x0;
  stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b0 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  ScanRoots<GcHeap::GcHeapImpl::VerifyHeap()::_lambda(Sexp**)_1_>
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&ptr);
  p_Var3 = (this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->finalize_queue) {
    do {
      if (stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::vector<Sexp*,std::allocator<Sexp*>>::_M_realloc_insert<Sexp*const&>
                  ((vector<Sexp*,std::allocator<Sexp*>> *)&ptr,
                   (iterator)
                   stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_start,(Sexp **)(p_Var3 + 1));
      }
      else {
        *stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
         _M_start = (Sexp *)p_Var3[1]._M_next;
        stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
        _M_start = stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->finalize_queue);
  }
  if (ptr != (Sexp *)stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                     super__Vector_impl_data._M_start) {
    do {
      local_50 = stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                 super__Vector_impl_data._M_start[-1];
      stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
      _M_start = stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                 super__Vector_impl_data._M_start + -1;
      if (*(long **)((long)local_b0 + ((ulong)local_50 % (ulong)visited._M_h._M_buckets) * 8) !=
          (long *)0x0) {
        plVar1 = (long *)**(long **)((long)local_b0 +
                                    ((ulong)local_50 % (ulong)visited._M_h._M_buckets) * 8);
        pSVar2 = (Sexp *)plVar1[1];
        do {
          if (local_50 == pSVar2) goto LAB_001106b4;
          plVar1 = (long *)*plVar1;
        } while ((plVar1 != (long *)0x0) &&
                (pSVar2 = (Sexp *)plVar1[1],
                (ulong)pSVar2 % (ulong)visited._M_h._M_buckets ==
                (ulong)local_50 % (ulong)visited._M_h._M_buckets));
      }
      visited._M_h._M_single_bucket = (__node_base_ptr)local_b0;
      std::
      _Hashtable<Sexp*,Sexp*,std::allocator<Sexp*>,std::__detail::_Identity,std::equal_to<Sexp*>,std::hash<Sexp*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<Sexp*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Sexp*,false>>>>
                ((_Hashtable<Sexp*,Sexp*,std::allocator<Sexp*>,std::__detail::_Identity,std::equal_to<Sexp*>,std::hash<Sexp*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_b0,&local_50,&visited._M_h._M_single_bucket);
      if ((local_50 < (Sexp *)this->heap_start) || ((Sexp *)this->heap_end < local_50)) {
        __assert_fail("(uint8_t *)ptr >= heap_start && (uint8_t *)ptr <= heap_end && \"pointer not in heap!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                      ,0x199,"void GcHeap::GcHeapImpl::VerifyHeap()");
      }
      if (local_50->padding == 0xabababababababab) {
        __assert_fail("ptr->padding != 0xabababababababab && \"observed a pointer that has been relocated!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                      ,0x19b,"void GcHeap::GcHeapImpl::VerifyHeap()");
      }
      local_70._8_8_ = 0;
      local_70._M_unused._M_object = &ptr;
      local_58 = std::
                 _Function_handler<void_(Sexp_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp:412:26)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<void_(Sexp_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp:412:26)>
                 ::_M_manager;
      Sexp::TracePointers(local_50,(function<void_(Sexp_**)> *)&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
LAB_001106b4:
    } while (ptr != (Sexp *)stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_b0);
  if (ptr != (Sexp *)0x0) {
    operator_delete(ptr,(long)stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ptr);
  }
  return;
}

Assistant:

void VerifyHeap() {
// The basic idea here is to traverse the entire
// heap and verify that every pointer is 1) within
// the valid heap range (i.e. we didn't accidentally introduce
// any wild pointers during a GC) and to ensure that every pointer
// points to a non-relocated object.
//
// When an object is relocated in a debug build, it is replaced
// with the bit pattern 0xab - if we see a pointer here that
// observes that bit pattern, we know that we failed to update
// a pointer somewhere.
#ifdef DEBUG
    DebugLog("[%d] verifying heap", gc_number);
    std::vector<Sexp *> stack;
    std::unordered_set<Sexp *> visited;
    ScanRoots([&](Sexp **ptr) {
      if (ptr == nullptr || *ptr == nullptr) {
        return;
      }

      if ((*ptr)->IsEmpty()) {
        return;
      }

      stack.push_back(*ptr);
    });

    // make sure we relocated the finalize queue right
    for (auto &it : finalize_queue) {
      stack.push_back(it);
    }

    while (!stack.empty()) {
      Sexp *ptr = stack.back();
      stack.pop_back();
      if (visited.count(ptr) != 0) {
        continue;
      }

      visited.insert(ptr);
      assert((uint8_t *)ptr >= heap_start && (uint8_t *)ptr <= heap_end &&
             "pointer not in heap!");
      assert(ptr->padding != 0xabababababababab &&
             "observed a pointer that has been relocated!");
      ptr->TracePointers([&](Sexp **child) {
        assert(child != nullptr && "passed a null pointer to TracePointers!");
        assert(*child != nullptr && "observed a null pointer!");
        if ((*child)->IsEmpty()) {
          return;
        }

        stack.push_back(*child);
      });

      // DebugLog("heap verify: object %s is reachable",
      // ptr->DumpString().c_str());
    }
#endif
  }